

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall
RandomForest::Node<float>::GetSampleList
          (Node<float> *this,shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_posSampleList,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_negSampleList)

{
  float fVar1;
  bool bVar2;
  ulong uVar3;
  element_type *peVar4;
  size_type sVar5;
  reference pvVar6;
  element_type *this_00;
  __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  element_type *this_02;
  reference pvVar7;
  element_type *peVar8;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_90;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_80;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_70;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_60 [2];
  undefined1 local_40 [24];
  value_type local_28;
  float label;
  int tempIndex;
  int i;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_negSampleList_local;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_posSampleList_local;
  Node<float> *this_local;
  
  _tempIndex = o_negSampleList;
  o_negSampleList_local = o_posSampleList;
  o_posSampleList_local = (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)this;
  if (this->featureIndex == -1) {
    label = 0.0;
    while( true ) {
      uVar3 = (ulong)(int)label;
      peVar4 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->sampleIndexList);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(peVar4);
      if (sVar5 <= uVar3) break;
      peVar4 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->sampleIndexList);
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(peVar4,(long)(int)label);
      local_28 = *pvVar6;
      ODTree<float>::GetTrainData((ODTree<float> *)local_40);
      this_00 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_40);
      this_01 = (__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
                   ::at(this_00,(long)local_28);
      this_02 = std::
                __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_01);
      pvVar7 = std::vector<float,_std::allocator<float>_>::back(this_02);
      fVar1 = *pvVar7;
      std::
      shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>_>
                     *)local_40);
      local_40._20_4_ = fVar1;
      if (fVar1 <= 0.0) {
        peVar4 = std::
                 __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)o_negSampleList);
        std::vector<int,_std::allocator<int>_>::push_back(peVar4,&local_28);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)o_posSampleList);
        std::vector<int,_std::allocator<int>_>::push_back(peVar4,&local_28);
      }
      label = (float)((int)label + 1);
    }
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar2) {
      peVar8 = std::
               __shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr(local_60,o_posSampleList)
      ;
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
                (&local_70,o_negSampleList);
      GetSampleList(peVar8,local_60,&local_70);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_70);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(local_60);
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->right);
    if (bVar2) {
      peVar8 = std::
               __shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->right);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
                (&local_80,o_posSampleList);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
                (&local_90,o_negSampleList);
      GetSampleList(peVar8,&local_80,&local_90);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_90);
      std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_80);
    }
  }
  return;
}

Assistant:

void RandomForest::Node<T>::GetSampleList(std::shared_ptr<std::vector<int> > o_posSampleList, std::shared_ptr<std::vector<int> > o_negSampleList) const
{
    if (featureIndex==-1)
    {
        for(int i=0; i<sampleIndexList->size(); i++)
        {
            int tempIndex=sampleIndexList->at(i);
            T label=tree->GetTrainData()->at(tempIndex)->back();
            if (label > 0)
            {
                o_posSampleList->push_back(tempIndex);
            }
            else{
                o_negSampleList->push_back(tempIndex);
            }
        }
        return;
    }
    if (left)
    {
        left->GetSampleList(o_posSampleList,o_negSampleList);
    }

    if (right)
    {
        right->GetSampleList(o_posSampleList,o_negSampleList);
    }
}